

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O0

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::Jacobian
          (TPZGeoBlend<pzgeom::TPZGeoTriangle> *this,TPZFMatrix<double> *coord,TPZVec<double> *par,
          TPZFMatrix<double> *jacobian,TPZFMatrix<double> *axes,REAL *detjac,
          TPZFMatrix<double> *jacinv)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  int64_t iVar7;
  double *pdVar8;
  int64_t iVar9;
  TPZFMatrix<double> *this_00;
  double *pdVar10;
  TPZManVector<double,_10> *this_01;
  TPZBaseMatrix *in_RCX;
  TPZVec<double> *in_RDX;
  long in_RDI;
  double *in_R9;
  REAL RVar11;
  double dVar12;
  _func_int **pp_Var13;
  long *in_stack_00000008;
  TPZFNMatrix<9,_double> axest;
  int c;
  int b_2;
  int a_3;
  int a_2;
  int b_1;
  int a_1;
  int b;
  TPZManVector<double,_10> parChanged;
  int a;
  TPZManVector<double,_3> DblendTemp;
  REAL blendTemp;
  int sidedim;
  TPZFNMatrix<9,_double> Inv;
  int dim;
  TPZGeoElSide neighbyside;
  int byside;
  TPZGeoMesh *gmesh;
  REAL Det;
  TPZFNMatrix<9,_double> Jneighbourhood;
  TPZFNMatrix<9,_double> JacTemp;
  TPZFNMatrix<9,_double> Ax;
  TPZFNMatrix<9,_double> J2;
  TPZFNMatrix<9,_double> J1;
  TPZFNMatrix<24,_double> Dblend;
  TPZFNMatrix<24,_double> blend;
  TPZStack<int,_10> LowAllSides;
  TPZStack<int,_10> LowNodeSides;
  TPZManVector<double,_10> SidesCounter;
  int majorSide;
  TPZManVector<double,_3> XNode;
  TPZManVector<double,_3> Xside;
  TPZManVector<double,_3> SidePar;
  TPZManVector<double,_3> NeighPar;
  TPZGeoEl *gel;
  TPZFMatrix<double> *in_stack_fffffffffffff188;
  TPZManVector<double,_10> *in_stack_fffffffffffff190;
  TPZGeoMesh *in_stack_fffffffffffff198;
  TPZFNMatrix<9,_double> *in_stack_fffffffffffff1a0;
  TPZGeoBlend<pzgeom::TPZGeoTriangle> *in_stack_fffffffffffff1a8;
  TPZFNMatrix<24,_double> *in_stack_fffffffffffff1b0;
  double *in_stack_fffffffffffff1b8;
  TPZManVector<double,_10> *in_stack_fffffffffffff1c0;
  TPZMatrix<double> *in_stack_fffffffffffff1c8;
  TPZFNMatrix<9,_double> *in_stack_fffffffffffff1d0;
  undefined8 in_stack_fffffffffffff1d8;
  TPZFMatrix<double> *in_stack_fffffffffffff1e0;
  TPZFMatrix<double> *in_stack_fffffffffffff1e8;
  undefined7 in_stack_fffffffffffff1f0;
  undefined1 in_stack_fffffffffffff1f7;
  TPZFMatrix<double> *in_stack_fffffffffffff230;
  TPZFMatrix<double> *in_stack_fffffffffffff280;
  TPZFMatrix<double> *in_stack_fffffffffffff288;
  TPZFMatrix<double> *in_stack_fffffffffffff290;
  int local_ba4;
  int local_ba0;
  int local_b9c;
  int local_b98;
  int local_b94;
  int local_b90;
  int local_b8c;
  TPZFMatrix<double> *in_stack_fffffffffffff478;
  TPZVec<double> *in_stack_fffffffffffff480;
  TPZVec<double> *in_stack_fffffffffffff488;
  int in_stack_fffffffffffff490;
  int in_stack_fffffffffffff494;
  TPZGeoBlend<pzgeom::TPZGeoTriangle> *in_stack_fffffffffffff498;
  int local_b14;
  TPZVec<double> local_b08;
  double local_ad0;
  int local_a98;
  int local_a94;
  int local_994;
  TPZGeoElSide local_990;
  int local_974;
  TPZGeoMesh *local_970;
  undefined8 local_880;
  TPZFMatrix<double> *in_stack_fffffffffffffd98;
  REAL *in_stack_fffffffffffffda0;
  TPZFMatrix<double> *in_stack_fffffffffffffda8;
  TPZFMatrix<double> *in_stack_fffffffffffffdb0;
  TPZVec<double> *in_stack_fffffffffffffdb8;
  TPZGeoElSide *in_stack_fffffffffffffdc0;
  TPZVec<int> local_200 [2];
  undefined8 local_1b8;
  TPZVec<double> local_1b0 [3];
  int local_13c;
  undefined8 local_138;
  undefined8 local_f8;
  TPZVec<double> local_f0 [5];
  TPZGeoEl *local_38;
  double *local_30;
  TPZBaseMatrix *local_20;
  TPZVec<double> *local_18;
  
  local_38 = *(TPZGeoEl **)(in_RDI + 0x20);
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff1b0,(int64_t)in_stack_fffffffffffff1a8
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff1b0,(int64_t)in_stack_fffffffffffff1a8
            );
  local_f8 = 0;
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff1c0,(int64_t)in_stack_fffffffffffff1b8
             ,(double *)in_stack_fffffffffffff1b0);
  local_138 = 0;
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff1c0,(int64_t)in_stack_fffffffffffff1b8
             ,(double *)in_stack_fffffffffffff1b0);
  local_13c = 6;
  local_1b8 = 0;
  TPZManVector<double,_10>::TPZManVector
            (in_stack_fffffffffffff1c0,(int64_t)in_stack_fffffffffffff1b8,
             (double *)in_stack_fffffffffffff1b0);
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)in_stack_fffffffffffff1a0);
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)in_stack_fffffffffffff1a0);
  TPZFNMatrix<24,_double>::TPZFNMatrix
            (in_stack_fffffffffffff1b0,(int64_t)in_stack_fffffffffffff1a8,
             (int64_t)in_stack_fffffffffffff1a0);
  TPZFNMatrix<24,_double>::TPZFNMatrix
            (in_stack_fffffffffffff1b0,(int64_t)in_stack_fffffffffffff1a8,
             (int64_t)in_stack_fffffffffffff1a0);
  pztopology::TPZTriangle::Shape
            (&in_stack_fffffffffffff190->super_TPZVec<double>,in_stack_fffffffffffff188,
             (TPZFMatrix<double> *)0x1643efb);
  TPZFNMatrix<9,_double>::TPZFNMatrix(in_stack_fffffffffffff1a0);
  TPZFNMatrix<9,_double>::TPZFNMatrix(in_stack_fffffffffffff1a0);
  TPZFNMatrix<9,_double>::TPZFNMatrix(in_stack_fffffffffffff1a0);
  local_880 = 0;
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_fffffffffffff1d0,(int64_t)in_stack_fffffffffffff1c8,
             (int64_t)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8);
  TPZFNMatrix<9,_double>::TPZFNMatrix(in_stack_fffffffffffff1a0);
  local_970 = TPZGeoEl::Mesh(local_38);
  local_974 = local_13c;
  do {
    if (local_974 < 3) {
      for (local_b9c = 0; local_b9c < 3; local_b9c = local_b9c + 1) {
        for (local_ba0 = 0; local_ba0 < 3; local_ba0 = local_ba0 + 1) {
          for (local_ba4 = 0; local_ba4 < 2; local_ba4 = local_ba4 + 1) {
            pdVar8 = TPZVec<double>::operator[](local_1b0,(long)local_b9c);
            dVar12 = *pdVar8;
            pdVar8 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff1b0->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff1a8,
                                (int64_t)in_stack_fffffffffffff1a0);
            dVar1 = *pdVar8;
            pdVar8 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff1b0->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff1a8,
                                (int64_t)in_stack_fffffffffffff1a0);
            dVar2 = *pdVar8;
            pdVar8 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff1b0->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff1a8,
                                (int64_t)in_stack_fffffffffffff1a0);
            *pdVar8 = (1.0 - dVar12) * dVar1 * dVar2 + *pdVar8;
          }
        }
      }
      TPZFNMatrix<9,_double>::TPZFNMatrix(in_stack_fffffffffffff1a0);
      TPZFMatrix<double>::GramSchmidt
                (in_stack_fffffffffffff290,in_stack_fffffffffffff288,in_stack_fffffffffffff280);
      TPZFMatrix<double>::Transpose
                (&in_stack_fffffffffffff1d0->super_TPZFMatrix<double>,in_stack_fffffffffffff1c8);
      iVar7 = TPZBaseMatrix::Rows(local_20);
      iVar9 = TPZBaseMatrix::Cols(local_20);
      (**(code **)(*in_stack_00000008 + 0x68))(in_stack_00000008,iVar7,iVar9);
      pdVar8 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffff1b0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffff1a8,(int64_t)in_stack_fffffffffffff1a0);
      dVar12 = *pdVar8;
      pdVar8 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffff1b0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffff1a8,(int64_t)in_stack_fffffffffffff1a0);
      dVar1 = *pdVar8;
      pdVar8 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffff1b0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffff1a8,(int64_t)in_stack_fffffffffffff1a0);
      dVar2 = *pdVar8;
      pdVar8 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffff1b0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffff1a8,(int64_t)in_stack_fffffffffffff1a0);
      *local_30 = dVar12 * dVar1 - dVar2 * *pdVar8;
      bVar5 = IsZero(*local_30);
      if (bVar5) {
        RVar11 = ZeroTolerance();
        *local_30 = RVar11;
      }
      pdVar8 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffff1b0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffff1a8,(int64_t)in_stack_fffffffffffff1a0);
      dVar12 = *pdVar8 / *local_30;
      pdVar8 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffff1b0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffff1a8,(int64_t)in_stack_fffffffffffff1a0);
      *pdVar8 = dVar12;
      pdVar8 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffff1b0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffff1a8,(int64_t)in_stack_fffffffffffff1a0);
      dVar12 = *pdVar8 / *local_30;
      pdVar8 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffff1b0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffff1a8,(int64_t)in_stack_fffffffffffff1a0);
      *pdVar8 = dVar12;
      this_00 = (TPZFMatrix<double> *)
                TPZFMatrix<double>::operator()
                          (&in_stack_fffffffffffff1b0->super_TPZFMatrix<double>,
                           (int64_t)in_stack_fffffffffffff1a8,(int64_t)in_stack_fffffffffffff1a0);
      dVar12 = -(double)(this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                        _vptr_TPZSavable / *local_30;
      pdVar8 = TPZFMatrix<double>::operator()
                         (this_00,(int64_t)in_stack_fffffffffffff1a8,(int64_t)dVar12);
      *pdVar8 = dVar12;
      pdVar10 = TPZFMatrix<double>::operator()(this_00,(int64_t)pdVar8,(int64_t)dVar12);
      pp_Var13 = (_func_int **)(-*pdVar10 / *local_30);
      this_01 = (TPZManVector<double,_10> *)
                TPZFMatrix<double>::operator()(this_00,(int64_t)pdVar8,(int64_t)dVar12);
      (this_01->super_TPZVec<double>)._vptr_TPZVec = pp_Var13;
      TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1644f5f);
      TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1644f6c);
      TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1644f79);
      TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1644f86);
      TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1644f93);
      TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1644fa0);
      TPZFNMatrix<24,_double>::~TPZFNMatrix((TPZFNMatrix<24,_double> *)0x1644fad);
      TPZFNMatrix<24,_double>::~TPZFNMatrix((TPZFNMatrix<24,_double> *)0x1644fba);
      TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x1644fc7);
      TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x1644fd4);
      TPZManVector<double,_10>::~TPZManVector(this_01);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)this_01);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)this_01);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)this_01);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)this_01);
      return;
    }
    Neighbour(in_stack_fffffffffffff1a8,(int)((ulong)in_stack_fffffffffffff1a0 >> 0x20),
              in_stack_fffffffffffff198);
    iVar6 = TPZGeoElSide::Exists(&local_990);
    if (iVar6 == 0) {
LAB_016449ab:
      local_a98 = 0;
    }
    else {
      pztopology::TPZTriangle::LowerDimensionSides
                ((int)((ulong)in_stack_fffffffffffff1a0 >> 0x20),
                 (TPZStack<int,_10> *)in_stack_fffffffffffff198,
                 (int)((ulong)in_stack_fffffffffffff190 >> 0x20));
      pztopology::TPZTriangle::LowerDimensionSides
                ((int)((ulong)in_stack_fffffffffffff1a0 >> 0x20),
                 (TPZStack<int,_10> *)in_stack_fffffffffffff198);
      Neighbour(in_stack_fffffffffffff1a8,(int)((ulong)in_stack_fffffffffffff1a0 >> 0x20),
                in_stack_fffffffffffff198);
      iVar6 = TPZGeoElSide::Dimension((TPZGeoElSide *)in_stack_fffffffffffff190);
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x164406c);
      local_994 = iVar6;
      TPZFNMatrix<9,_double>::TPZFNMatrix
                ((TPZFNMatrix<9,_double> *)in_stack_fffffffffffff1b0,
                 (int64_t)in_stack_fffffffffffff1a8,(int64_t)in_stack_fffffffffffff1a0);
      local_a94 = TPZGeoElSide::Dimension((TPZGeoElSide *)in_stack_fffffffffffff190);
      bVar5 = MapToNeighSide<double>
                        (in_stack_fffffffffffff498,in_stack_fffffffffffff494,
                         in_stack_fffffffffffff490,in_stack_fffffffffffff488,
                         in_stack_fffffffffffff480,in_stack_fffffffffffff478);
      if (bVar5) {
        Neighbour(in_stack_fffffffffffff1a8,(int)((ulong)in_stack_fffffffffffff1a0 >> 0x20),
                  in_stack_fffffffffffff198);
        TPZGeoElSide::X((TPZGeoElSide *)
                        CONCAT17(in_stack_fffffffffffff1f7,in_stack_fffffffffffff1f0),
                        (TPZVec<double> *)in_stack_fffffffffffff1e8,
                        (TPZVec<double> *)in_stack_fffffffffffff1e0);
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x164431d);
        Neighbour(in_stack_fffffffffffff1a8,(int)((ulong)in_stack_fffffffffffff1a0 >> 0x20),
                  in_stack_fffffffffffff198);
        TPZGeoElSide::Jacobian
                  (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                   in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1644387);
        TPZFMatrix<double>::Transpose(in_stack_fffffffffffff230);
        TPZMatrix<double>::Multiply
                  ((TPZMatrix<double> *)
                   CONCAT17(in_stack_fffffffffffff1f7,in_stack_fffffffffffff1f0),
                   in_stack_fffffffffffff1e8,in_stack_fffffffffffff1e0,
                   (int)((ulong)in_stack_fffffffffffff1d8 >> 0x20));
        TPZMatrix<double>::Multiply
                  ((TPZMatrix<double> *)
                   CONCAT17(in_stack_fffffffffffff1f7,in_stack_fffffffffffff1f0),
                   in_stack_fffffffffffff1e8,in_stack_fffffffffffff1e0,
                   (int)((ulong)in_stack_fffffffffffff1d8 >> 0x20));
        local_ad0 = 0.0;
        TPZManVector<double,_3>::TPZManVector
                  ((TPZManVector<double,_3> *)in_stack_fffffffffffff1c0,
                   (int64_t)in_stack_fffffffffffff1b8,(double *)in_stack_fffffffffffff1b0);
        for (local_b14 = 0; iVar7 = TPZVec<int>::NElements(local_200), local_b14 < iVar7;
            local_b14 = local_b14 + 1) {
          TPZVec<double>::NElements(local_18);
          TPZManVector<double,_10>::TPZManVector
                    ((TPZManVector<double,_10> *)in_stack_fffffffffffff1b0,
                     (int64_t)in_stack_fffffffffffff1a8);
          pztopology::TPZTriangle::Shape
                    (&in_stack_fffffffffffff190->super_TPZVec<double>,in_stack_fffffffffffff188,
                     (TPZFMatrix<double> *)0x16444a2);
          TPZVec<int>::operator[](local_200,(long)local_b14);
          pdVar8 = TPZFMatrix<double>::operator()
                             (&in_stack_fffffffffffff1b0->super_TPZFMatrix<double>,
                              (int64_t)in_stack_fffffffffffff1a8,(int64_t)in_stack_fffffffffffff1a0)
          ;
          local_ad0 = *pdVar8 + local_ad0;
          for (local_b8c = 0; local_b8c < 2; local_b8c = local_b8c + 1) {
            TPZVec<int>::operator[](local_200,(long)local_b14);
            pdVar8 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff1b0->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff1a8,
                                (int64_t)in_stack_fffffffffffff1a0);
            dVar12 = *pdVar8;
            pdVar8 = TPZVec<double>::operator[](&local_b08,(long)local_b8c);
            *pdVar8 = dVar12 + *pdVar8;
          }
          TPZManVector<double,_10>::~TPZManVector(in_stack_fffffffffffff190);
        }
        for (local_b90 = 0; local_b90 < 3; local_b90 = local_b90 + 1) {
          for (local_b94 = 0; local_b94 < 2; local_b94 = local_b94 + 1) {
            pdVar8 = TPZVec<double>::operator[](local_1b0,(long)local_974);
            dVar12 = *pdVar8;
            pdVar8 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff1b0->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff1a8,
                                (int64_t)in_stack_fffffffffffff1a0);
            dVar4 = local_ad0;
            dVar1 = *pdVar8;
            pdVar8 = TPZVec<double>::operator[](local_f0,(long)local_b90);
            dVar2 = *pdVar8;
            pdVar8 = TPZVec<double>::operator[](&local_b08,(long)local_b94);
            dVar3 = *pdVar8;
            pdVar8 = TPZFMatrix<double>::operator()
                               (&in_stack_fffffffffffff1b0->super_TPZFMatrix<double>,
                                (int64_t)in_stack_fffffffffffff1a8,
                                (int64_t)in_stack_fffffffffffff1a0);
            *pdVar8 = (1.0 - dVar12) * (dVar1 * dVar4 + dVar2 * dVar3) + *pdVar8;
          }
        }
        for (local_b98 = 0; iVar7 = TPZVec<int>::NElements((TPZVec<int> *)&stack0xfffffffffffffdb8),
            local_b98 < iVar7; local_b98 = local_b98 + 1) {
          pdVar8 = TPZVec<double>::operator[](local_1b0,(long)local_974);
          in_stack_fffffffffffff288 = (TPZFMatrix<double> *)(1.0 - *pdVar8);
          in_stack_fffffffffffff290 =
               (TPZFMatrix<double> *)
               TPZVec<int>::operator[]((TPZVec<int> *)&stack0xfffffffffffffdb8,(long)local_b98);
          in_stack_fffffffffffff280 =
               (TPZFMatrix<double> *)
               TPZVec<double>::operator[]
                         (local_1b0,
                          (long)*(int *)&(in_stack_fffffffffffff290->super_TPZMatrix<double>).
                                         super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable);
          (in_stack_fffffffffffff280->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable =
               (_func_int **)
               ((double)in_stack_fffffffffffff288 +
               (double)(in_stack_fffffffffffff280->super_TPZMatrix<double>).super_TPZBaseMatrix.
                       super_TPZSavable._vptr_TPZSavable);
        }
        TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffff190)
        ;
        local_a98 = 0;
      }
      else {
        local_a98 = 4;
      }
      TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1644980);
      if (local_a98 == 0) goto LAB_016449ab;
    }
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x16449c3);
    local_974 = local_974 + -1;
  } while( true );
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::Jacobian(TPZFMatrix<REAL> &coord, TPZVec<REAL>& par, TPZFMatrix<REAL> &jacobian, TPZFMatrix<REAL> &axes,REAL &detjac,TPZFMatrix<REAL> &jacinv) const
{

    TPZGeoEl &gel = *fGeoEl;
    TPZManVector<REAL,3> NeighPar, SidePar, Xside(3,0.), XNode(3,0.);
    int majorSide = TGeo::NSides - 1;
	
    TPZManVector<REAL> SidesCounter(TGeo::NSides,0);
    TPZStack<int> LowNodeSides, LowAllSides;
	
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "input parameter par " << par;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	
    TPZFNMatrix<24> blend(TGeo::NNodes,1), Dblend(TGeo::Dimension,TGeo::NNodes);
    TGeo::Shape(par,blend,Dblend);
	
    TPZFNMatrix<9> J1, J2, Ax, JacTemp(3,TGeo::Dimension, 0.), Jneighbourhood;
    REAL Det;
    TPZGeoMesh *gmesh = gel.Mesh();
    for(int byside = majorSide; byside >= TGeo::NNodes; byside--)
    {
        TPZGeoElSide neighbyside = Neighbour(byside, gmesh);
        if(neighbyside.Exists())
        {
            TGeo::LowerDimensionSides(byside,LowNodeSides,0);
            TGeo::LowerDimensionSides(byside,LowAllSides);
            int dim = Neighbour(byside, gmesh).Dimension();
            TPZFNMatrix<9> Inv(dim,dim);
            int sidedim = neighbyside.Dimension();
            if(!MapToNeighSide(byside,sidedim,par,NeighPar, Jneighbourhood))
			{
				continue;
			}
            Neighbour(byside,gmesh).X(NeighPar,Xside);
            Neighbour(byside,gmesh).Jacobian(NeighPar,J1,Ax,Det,Inv);
            Ax.Transpose(); 
            Ax.Multiply(J1,J2);
			
#ifdef PZ_LOG
			if(logger.isDebugEnabled())
			{
				std::stringstream sout;
				sout << "byside " << byside << std::endl;
        		sout << "side of the neighbour " << Neighbour(byside,gmesh).Side() << std::endl;
        		Neighbour(byside,gmesh).Element()->Print(sout);
				sout << "neighbour parameter(NeighPar) " << NeighPar << std::endl;
				sout << "Jacobian of the map(Jneighborhood) " << Jneighbourhood << std::endl;
				sout << "Xside " << Xside << std::endl;
				sout << "jacobian neighbour(J1) " << J1 << std::endl;
        		Ax.Print("Ax of the neighbour (Ax) ",sout);
				sout << "jacobian of the neighbour multiplied by the axes(J2) " << J2 << std::endl;
				LOGPZ_DEBUG(logger,sout.str())
			}
#endif
			
            J2.Multiply(Jneighbourhood,J1);
			
#ifdef PZ_LOG
			if(logger.isDebugEnabled())
			{
				std::stringstream sout;
				sout << "acumulated jacobian(J1) " << J1 << std::endl;
				LOGPZ_DEBUG(logger,sout.str())
			}
#endif
			
            REAL blendTemp = 0.; 
            TPZManVector<REAL,3> DblendTemp(TGeo::Dimension,0.);
            for(int a = 0; a < LowNodeSides.NElements(); a++)
            {
                TPZManVector<REAL> parChanged(par.NElements());
                TGeo::Shape(parChanged,blend,Dblend);
				
                blendTemp += blend(LowNodeSides[a],0);
                for(int b = 0; b < TGeo::Dimension; b++)
                {
                    DblendTemp[b] += Dblend(b,LowNodeSides[a]);
                }
            }
			
            for(int a = 0; a < 3; a++)
            {
                for(int b = 0; b < TGeo::Dimension; b++)
                {
                    JacTemp(a,b) += (1 - SidesCounter[byside]) * (J1(a,b)*blendTemp + Xside[a]*DblendTemp[b]);
                }
            }
            for(int a = 0; a < LowAllSides.NElements(); a++) 
            {
                SidesCounter[LowAllSides[a]] += (1 - SidesCounter[byside]);
            }
        }
    }
	
#ifdef PZ_LOG
    if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		JacTemp.Print("Jabobian before contributing the nodes",sout);
		sout << "SidesCounter " << SidesCounter << std::endl;
		sout << "DBlend " << Dblend << std::endl;
		sout << "NodeCoord " << coord << std::endl;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	
    for(int a = 0; a < TGeo::NNodes; a++)
    {
        for(int b = 0; b < 3; b++) 
        { 
            for(int c = 0; c < TGeo::Dimension; c++)
            {
            	JacTemp(b,c) += (1 - SidesCounter[a]) * coord(b,a)*Dblend(c,a);
            }
        }
    }
	
    if(TGeo::Dimension == 1)
    {
        TPZFNMatrix<9> axest;
        JacTemp.GramSchmidt(axest,jacobian);
        axest.Transpose(&axes);
        jacinv.Resize(jacobian.Rows(), jacobian.Cols());
        detjac = jacobian(0,0);
        if(IsZero(detjac)){
            detjac = ZeroTolerance();
        }
        jacinv(0,0) = 1./detjac;
    } else if(TGeo::Dimension == 2)
    {
        TPZFNMatrix<9> axest;
        JacTemp.GramSchmidt(axest,jacobian);
        axest.Transpose(&axes);
        
        jacinv.Resize(jacobian.Rows(), jacobian.Cols());
        
        detjac = jacobian(0,0)*jacobian(1,1) - jacobian(1,0)*jacobian(0,1);
        if(IsZero(detjac)){
            detjac = ZeroTolerance();
        }
        jacinv(0,0) =  jacobian(1,1) / detjac;
        jacinv(1,1) =  jacobian(0,0) / detjac;
        jacinv(0,1) = -jacobian(0,1) / detjac;
        jacinv(1,0) = -jacobian(1,0) / detjac;
    }
    else
    {
        jacobian = JacTemp;
        axes.Resize(3,3); axes.Zero();
        
        jacinv.Resize(jacobian.Rows(), jacobian.Cols());
        
        axes(0,0) = 1.; axes(1,1) = 1.; axes(2,2) = 1.;
        detjac = -jacobian(0,2)*jacobian(1,1)*jacobian(2,0);//- a02 a11 a20
        detjac += jacobian(0,1)*jacobian(1,2)*jacobian(2,0);//+ a01 a12 a20
        detjac += jacobian(0,2)*jacobian(1,0)*jacobian(2,1);//+ a02 a10 a21
        detjac -= jacobian(0,0)*jacobian(1,2)*jacobian(2,1);//- a00 a12 a21
        detjac -= jacobian(0,1)*jacobian(1,0)*jacobian(2,2);//- a01 a10 a22
        detjac += jacobian(0,0)*jacobian(1,1)*jacobian(2,2);//+ a00 a11 a22
        
        if(IsZero(detjac))
		{
#ifdef PZ_LOG
            if(logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Singular Jacobian " << detjac;
                LOGPZ_ERROR(logger, sout.str())
            }
#endif
			detjac = ZeroTolerance();
		}
        
        jacinv(0,0) = (-jacobian(1,2)*jacobian(2,1)+jacobian(1,1)*jacobian(2,2)) / detjac;//-a12 a21 + a11 a22
        jacinv(0,1) = ( jacobian(0,2)*jacobian(2,1)-jacobian(0,1)*jacobian(2,2)) / detjac;// a02 a21 - a01 a22
        jacinv(0,2) = (-jacobian(0,2)*jacobian(1,1)+jacobian(0,1)*jacobian(1,2)) / detjac;//-a02 a11 + a01 a12
        jacinv(1,0) = ( jacobian(1,2)*jacobian(2,0)-jacobian(1,0)*jacobian(2,2)) / detjac;// a12 a20 - a10 a22
        jacinv(1,1) = (-jacobian(0,2)*jacobian(2,0)+jacobian(0,0)*jacobian(2,2)) / detjac;//-a02 a20 + a00 a22
        jacinv(1,2) = ( jacobian(0,2)*jacobian(1,0)-jacobian(0,0)*jacobian(1,2)) / detjac;// a02 a10 - a00 a12
        jacinv(2,0) = (-jacobian(1,1)*jacobian(2,0)+jacobian(1,0)*jacobian(2,1)) / detjac;//-a11 a20 + a10 a21
        jacinv(2,1) = ( jacobian(0,1)*jacobian(2,0)-jacobian(0,0)*jacobian(2,1)) / detjac;// a01 a20 - a00 a21
        jacinv(2,2) = (-jacobian(0,1)*jacobian(1,0)+jacobian(0,0)*jacobian(1,1)) / detjac;//-a01 a10 + a00 a11
    }
}